

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O1

void __thiscall
vkt::wsi::anon_unknown_0::InstanceHelper::InstanceHelper
          (InstanceHelper *this,Context *context,Type wsiType,VkAllocationCallbacks *pAllocator)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  PlatformInterface *pPVar2;
  VkInstance_s *pVVar3;
  DestroyInstanceFunc p_Var4;
  VkAllocationCallbacks *pVVar5;
  bool bVar6;
  char *__s;
  NotSupportedError *this_00;
  pointer name_;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  RequiredExtension local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  Context *local_80;
  PlatformInterface *local_78;
  VkAllocationCallbacks *local_70;
  Move<vk::VkInstance_s_*> local_68;
  Maybe<unsigned_int> local_50;
  Maybe<unsigned_int> local_40;
  
  ::vk::enumerateInstanceExtensionProperties
            (&this->supportedExtensions,context->m_platformInterface,(char *)0x0);
  pPVar2 = context->m_platformInterface;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_d8.name.field_2;
  local_d8.name.field_2._M_allocated_capacity._0_6_ = 0x52484b5f4b56;
  local_d8.name.field_2._M_allocated_capacity._6_2_ = 0x735f;
  local_d8.name.field_2._8_6_ = 0x656361667275;
  local_d8.name._M_string_length = 0xe;
  local_d8.name.field_2._M_local_buf[0xe] = '\0';
  local_d8.name._M_dataplus._M_p = (pointer)paVar1;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
             &local_d8.name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8.name._M_dataplus._M_p,
                    CONCAT26(local_d8.name.field_2._M_allocated_capacity._6_2_,
                             local_d8.name.field_2._M_allocated_capacity._0_6_) + 1);
  }
  __s = ::vk::wsi::getExtensionName(wsiType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,__s,(allocator<char> *)&local_50);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
             &local_d8.name);
  local_80 = context;
  local_78 = pPVar2;
  local_70 = pAllocator;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8.name._M_dataplus._M_p,
                    CONCAT26(local_d8.name.field_2._M_allocated_capacity._6_2_,
                             local_d8.name.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if (local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    name_ = local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_50.m_ptr = (uint *)0x0;
      local_40.m_ptr = (uint *)0x0;
      ::vk::RequiredExtension::RequiredExtension(&local_d8,name_,&local_50,&local_40);
      bVar6 = ::vk::isExtensionSupported(&this->supportedExtensions,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.name._M_dataplus._M_p != &local_d8.name.field_2) {
        operator_delete(local_d8.name._M_dataplus._M_p,
                        CONCAT26(local_d8.name.field_2._M_allocated_capacity._6_2_,
                                 local_d8.name.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if (!bVar6) {
        this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::operator+(&local_d8.name,name_," is not supported");
        tcu::NotSupportedError::NotSupportedError
                  (this_00,local_d8.name._M_dataplus._M_p,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                   ,0x55);
        __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      name_ = name_ + 1;
    } while (name_ != local_98.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_d8.name._M_dataplus._M_p = (pointer)0x0;
  local_d8.name._M_string_length = 0;
  local_d8.name.field_2._M_allocated_capacity._0_6_ = 0;
  local_d8.name.field_2._M_allocated_capacity._6_2_ = 0;
  ::vk::createDefaultInstance
            (&local_68,local_78,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_d8,&local_98,local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  pVVar5 = local_68.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator;
  p_Var4 = local_68.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance;
  pVVar3 = local_68.super_RefBase<vk::VkInstance_s_*>.m_data.object;
  local_d8.name.field_2._M_allocated_capacity._0_6_ =
       SUB86(local_68.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,0);
  local_d8.name.field_2._M_allocated_capacity._6_2_ =
       (undefined2)
       ((ulong)local_68.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator >> 0x30);
  local_d8.name._M_dataplus._M_p = (pointer)local_68.super_RefBase<vk::VkInstance_s_*>.m_data.object
  ;
  local_d8.name._M_string_length =
       (size_type)local_68.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance;
  local_68.super_RefBase<vk::VkInstance_s_*>.m_data.object = (VkInstance_s *)0x0;
  local_68.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance =
       (DestroyInstanceFunc)0x0;
  local_68.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->instance).super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator = pVVar5;
  (this->instance).super_RefBase<vk::VkInstance_s_*>.m_data.object = pVVar3;
  (this->instance).super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance = p_Var4;
  ::vk::InstanceDriver::InstanceDriver
            (&this->vki,local_80->m_platformInterface,
             (this->instance).super_RefBase<vk::VkInstance_s_*>.m_data.object);
  return;
}

Assistant:

InstanceHelper (Context& context, Type wsiType, const VkAllocationCallbacks* pAllocator = DE_NULL)
		: supportedExtensions	(enumerateInstanceExtensionProperties(context.getPlatformInterface(),
																	  DE_NULL))
		, instance				(createInstanceWithWsi(context.getPlatformInterface(),
													   supportedExtensions,
													   wsiType,
													   pAllocator))
		, vki					(context.getPlatformInterface(), *instance)
	{}